

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O0

void __thiscall
Database::MaxHeap::insert
          (MaxHeap *this,uint32_t orderkey,uint16_t orderdate,uint32_t extendedpricesum)

{
  uint in_ECX;
  undefined2 in_DX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined2 in_stack_fffffffffffffff0;
  
  if (*(uint *)in_RDI[2] < in_ECX) {
    *(undefined4 *)*in_RDI = in_ESI;
    *(undefined2 *)in_RDI[1] = in_DX;
    *(uint *)in_RDI[2] = in_ECX;
    adjust((MaxHeap *)CONCAT44(in_ESI,CONCAT22(in_DX,in_stack_fffffffffffffff0)),in_ECX);
  }
  return;
}

Assistant:

inline void insert(uint32_t orderkey, uint16_t orderdate, uint32_t extendedpricesum) {
      if (extendedpricesum <= c3Result[0]) {
        return;
      }

      c1Result[0] = orderkey;
      c2Result[0] = orderdate;
      c3Result[0] = extendedpricesum;
      adjust(size);
    }